

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

upb_Message_DeleteUnknownStatus
upb_Message_DeleteUnknown(upb_Message *msg,upb_StringView *data,uintptr_t *iter,upb_Arena *arena)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  _Bool _Var5;
  uintptr_t uVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  upb_Message_DeleteUnknownStatus uVar13;
  uint *puVar14;
  
  puVar14 = (uint *)(msg->field_0).internal_opaque;
  if (((ulong)puVar14 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb0,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  uVar8 = *iter;
  if (uVar8 == 0) {
    __assert_fail("*iter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb1,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (puVar14 == (uint *)0x0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb3,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (*puVar14 < uVar8) {
    __assert_fail("*iter <= in->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb4,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  uVar7 = *(ulong *)(puVar14 + uVar8 * 2);
  if ((uVar7 == 0) || ((uVar7 & 1) != 0)) {
    __assert_fail("upb_TaggedAuxPtr_IsUnknown(unknown_ptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb6,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  puVar12 = (ulong *)(uVar7 & 0xfffffffffffffffc);
  pcVar1 = (char *)*puVar12;
  uVar10 = puVar12[1];
  pcVar2 = data->data;
  if (pcVar1 == pcVar2) {
    uVar10 = uVar10 - data->size;
    if (uVar10 != 0) {
      *puVar12 = (ulong)(pcVar1 + data->size);
      puVar12[1] = uVar10;
      uVar8 = puVar12[1];
      data->data = (char *)*puVar12;
      data->size = uVar8;
      return kUpb_DeleteUnknown_IterUpdated;
    }
    (puVar14 + uVar8 * 2)[0] = 0;
    (puVar14 + uVar8 * 2)[1] = 0;
  }
  else if (pcVar1 + uVar10 == pcVar2 + data->size) {
    puVar12[1] = uVar10 - data->size;
    if ((uVar7 & 2) == 0) {
      *(ulong *)(puVar14 + *iter * 2) = uVar7 | 2;
    }
  }
  else {
    if ((pcVar2 <= pcVar1) || (pcVar1 + uVar10 <= pcVar2 + data->size)) {
      __assert_fail("unknown->data < data->data && unknown->data + unknown->size > data->data + data->size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                    ,0xca,
                    "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                   );
    }
    plVar9 = (long *)arena->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)plVar9) < 0x10) {
      plVar9 = (long *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x10);
    }
    else {
      if ((long *)((long)plVar9 + 7U & 0xfffffffffffffff8) != plVar9) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(plVar9 + 2);
    }
    if (plVar9 == (long *)0x0) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    _Var5 = _upb_Message_ReserveSlot_dont_copy_me__upb_internal_use_only(msg,arena);
    if (!_Var5) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    puVar14 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    uVar6 = *iter;
    if (*puVar14 - uVar6 != 0) {
      memmove(puVar14 + uVar6 * 2 + 4,puVar14 + uVar6 * 2 + 2,(*puVar14 - uVar6) * 8);
      uVar6 = *iter;
    }
    *(ulong *)(puVar14 + uVar6 * 2 + 2) = (ulong)plVar9 | 2;
    if ((uVar7 & 2) == 0) {
      *(ulong *)(puVar14 + *iter * 2) = uVar7 | 2;
    }
    *puVar14 = *puVar14 + 1;
    pcVar1 = data->data;
    sVar3 = data->size;
    *plVar9 = (long)(pcVar1 + sVar3);
    uVar8 = *puVar12;
    plVar9[1] = (puVar12[1] + uVar8) - (long)(pcVar1 + sVar3);
    puVar12[1] = (long)data->data - uVar8;
  }
  uVar8 = *iter;
  puVar14 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
  if (puVar14 == (uint *)0x0) {
LAB_0028d453:
    data->data = (char *)0x0;
    data->size = 0;
    uVar13 = kUpb_DeleteUnknown_DeletedLast;
  }
  else {
    uVar11 = (ulong)*puVar14;
    uVar7 = uVar8;
    uVar10 = uVar11;
    if (uVar11 < uVar8) {
      uVar10 = uVar8;
    }
    do {
      uVar8 = uVar10;
      if (uVar11 <= uVar7) goto LAB_0028d453;
      uVar4 = *(ulong *)(puVar14 + uVar7 * 2 + 2);
      uVar7 = uVar7 + 1;
      uVar10 = uVar8;
    } while ((uVar4 & 1) != 0 || uVar4 == 0);
    sVar3 = ((undefined8 *)(uVar4 & 0xfffffffffffffffc))[1];
    data->data = *(char **)(uVar4 & 0xfffffffffffffffc);
    data->size = sVar3;
    uVar13 = kUpb_DeleteUnknown_IterUpdated;
    uVar8 = uVar7;
  }
  *iter = uVar8;
  return uVar13;
}

Assistant:

upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message* msg,
                                                          upb_StringView* data,
                                                          uintptr_t* iter,
                                                          upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  UPB_ASSERT(*iter != kUpb_Message_UnknownBegin);
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  UPB_ASSERT(in);
  UPB_ASSERT(*iter <= in->size);
  upb_TaggedAuxPtr unknown_ptr = in->aux_data[*iter - 1];
  UPB_ASSERT(upb_TaggedAuxPtr_IsUnknown(unknown_ptr));
  upb_StringView* unknown = upb_TaggedAuxPtr_UnknownData(unknown_ptr);
  if (unknown->data == data->data && unknown->size == data->size) {
    // Remove whole field
    in->aux_data[*iter - 1] = upb_TaggedAuxPtr_Null();
  } else if (unknown->data == data->data) {
    // Strip prefix
    unknown->data += data->size;
    unknown->size -= data->size;
    *data = *unknown;
    return kUpb_DeleteUnknown_IterUpdated;
  } else if (unknown->data + unknown->size == data->data + data->size) {
    // Truncate existing field
    unknown->size -= data->size;
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] =
          upb_TaggedAuxPtr_MakeUnknownDataAliased(unknown);
    }
  } else {
    UPB_ASSERT(unknown->data < data->data &&
               unknown->data + unknown->size > data->data + data->size);
    // Split in the middle
    upb_StringView* prefix = unknown;
    upb_StringView* suffix = upb_Arena_Malloc(arena, sizeof(upb_StringView));
    if (!suffix) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    if (!UPB_PRIVATE(_upb_Message_ReserveSlot)(msg, arena)) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
    if (*iter != in->size) {
      // Shift later entries down so that unknown field ordering is preserved
      memmove(&in->aux_data[*iter + 1], &in->aux_data[*iter],
              sizeof(upb_TaggedAuxPtr) * (in->size - *iter));
    }
    in->aux_data[*iter] = upb_TaggedAuxPtr_MakeUnknownDataAliased(suffix);
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] = upb_TaggedAuxPtr_MakeUnknownDataAliased(prefix);
    }
    in->size++;
    suffix->data = data->data + data->size;
    suffix->size = (prefix->data + prefix->size) - suffix->data;
    prefix->size = data->data - prefix->data;
  }
  return upb_Message_NextUnknown(msg, data, iter)
             ? kUpb_DeleteUnknown_IterUpdated
             : kUpb_DeleteUnknown_DeletedLast;
}